

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

int __thiscall
ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
          (TemplateDictionaryPeer *this,TemplateString *section_name,
          vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
          *dicts)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  TemplateDictionary *local_20;
  
  if (*(long *)(dicts + 8) != *(long *)dicts) {
    *(long *)(dicts + 8) = *(long *)dicts;
  }
  cVar1 = (**(code **)(*(long *)this->dict_ + 0x28))(this->dict_,section_name);
  iVar2 = 0;
  if (cVar1 == '\0') {
    plVar3 = (long *)(**(code **)(*(long *)this->dict_ + 0x38))(this->dict_,section_name);
    while( true ) {
      cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
      if (cVar1 == '\0') break;
      local_20 = (TemplateDictionary *)(**(code **)(*plVar3 + 0x18))(plVar3);
      std::
      vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
      ::emplace_back<ctemplate::TemplateDictionary_const*>
                ((vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
                  *)dicts,&local_20);
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    iVar2 = (int)((ulong)(*(long *)(dicts + 8) - *(long *)dicts) >> 3);
  }
  return iVar2;
}

Assistant:

int TemplateDictionaryPeer::GetIncludeDictionaries(
    const TemplateString& section_name,
    vector<const TemplateDictionary*>* dicts) const {
  dicts->clear();
  if (dict_->IsHiddenTemplate(section_name))
    return 0;

  TemplateDictionaryInterface::Iterator* di =
      dict_->CreateTemplateIterator(section_name);
  while (di->HasNext())
    dicts->push_back(down_cast<const TemplateDictionary*>(&di->Next()));
  delete di;

  return static_cast<int>(dicts->size());
}